

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O0

QStringList *
QStandardPaths::locateAll(StandardLocation type,QString *fileName,LocateOptions options)

{
  bool bVar1;
  const_iterator o;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar2;
  QStringList *dirs;
  QStringList *result;
  QString path;
  const_iterator dir;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>
  *in_stack_fffffffffffffee8;
  QStringBuilder<const_QString_&,_char16_t> *in_stack_fffffffffffffef0;
  undefined5 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefd;
  char16_t in_stack_fffffffffffffefe;
  QStringList *path_00;
  QFlagsStorage<QStandardPaths::LocateOption> options_00;
  StandardLocation in_stack_ffffffffffffff84;
  const_iterator local_58 [5];
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  path_00 = in_RDI;
  standardLocations(in_stack_ffffffffffffff84);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x2f18aa);
  local_58[0].i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_58[0] = QList<QString>::constBegin((QList<QString> *)in_stack_fffffffffffffef0);
  while( true ) {
    o = QList<QString>::constEnd((QList<QString> *)in_stack_fffffffffffffef0);
    bVar1 = QList<QString>::const_iterator::operator!=(local_58,o);
    options_00.i = (Int)((ulong)o.i >> 0x20);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(local_58);
    QVar2 = ::operator+((QString *)
                        CONCAT26(in_stack_fffffffffffffefe,
                                 CONCAT15(in_stack_fffffffffffffefd,in_stack_fffffffffffffef8)),
                        (char16_t *)in_stack_fffffffffffffef0);
    local_30 = QVar2.a;
    in_stack_fffffffffffffefe = QVar2.b;
    local_28 = in_stack_fffffffffffffefe;
    ::operator+(in_stack_fffffffffffffef0,(QString *)in_stack_fffffffffffffee8);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffee8);
    in_stack_fffffffffffffefd = existsAsSpecified((QString *)path_00,(LocateOptions)options_00.i);
    if ((bool)in_stack_fffffffffffffefd) {
      QList<QString>::append
                ((QList<QString> *)in_stack_fffffffffffffef0,
                 (parameter_type)in_stack_fffffffffffffee8);
    }
    QString::~QString((QString *)0x2f1a56);
    QList<QString>::const_iterator::operator++(local_58);
  }
  QList<QString>::~QList((QList<QString> *)0x2f1a8d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return path_00;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QStandardPaths::locateAll(StandardLocation type, const QString &fileName, LocateOptions options)
{
    const QStringList &dirs = standardLocations(type);
    QStringList result;
    for (QStringList::const_iterator dir = dirs.constBegin(); dir != dirs.constEnd(); ++dir) {
        const QString path = *dir + u'/' + fileName;
        if (existsAsSpecified(path, options))
            result.append(path);
    }
    return result;
}